

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::ruby::GenerateMessageAssignment
          (ruby *this,string_view prefix,Descriptor *message,Printer *printer)

{
  string_view pc;
  Printer *this_00;
  bool bVar1;
  int iVar2;
  MessageOptions *this_01;
  Descriptor *pDVar3;
  EnumDescriptor *pEVar4;
  char *pcVar5;
  Printer *pPVar6;
  undefined1 auVar7 [16];
  string_view prefix_00;
  string_view prefix_01;
  string_view name;
  string_view name_00;
  int local_1a4;
  int i_1;
  int local_18c;
  undefined1 local_188 [4];
  int i;
  string_view local_158;
  string local_148;
  AlphaNum local_128;
  Descriptor *local_f8;
  size_t sStack_f0;
  AlphaNum local_e8;
  undefined1 local_b8 [8];
  string nested_prefix;
  string_view local_88 [2];
  string_view local_68;
  string local_58;
  string_view local_38;
  Printer *local_28;
  Printer *printer_local;
  Descriptor *message_local;
  string_view prefix_local;
  
  printer_local = (Printer *)prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  local_28 = (Printer *)message;
  message_local = (Descriptor *)this;
  this_01 = Descriptor::options((Descriptor *)printer_local);
  bVar1 = MessageOptions::map_entry(this_01);
  pPVar6 = local_28;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"$prefix$$name$ = ");
    local_68 = Descriptor::name((Descriptor *)printer_local);
    name._M_str = (char *)message;
    name._M_len = (size_t)local_68._M_str;
    RubifyConstant_abi_cxx11_(&local_58,(ruby *)local_68._M_len,name);
    protobuf::io::Printer::
    Print<char[7],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
              (pPVar6,local_38,(char (*) [7])0x208b319,
               (basic_string_view<char,_std::char_traits<char>_> *)&message_local,
               (char (*) [5])0x1d1c66d,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = local_28;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_88,
               "::Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").msgclass\n"
              );
    join_0x00000010_0x00000000_ = Descriptor::full_name((Descriptor *)printer_local);
    pcVar5 = "full_name";
    pPVar6 = (Printer *)((long)&nested_prefix.field_2 + 8);
    protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
              (this_00,local_88[0],(char (*) [10])0x208afb9,
               (basic_string_view<char,_std::char_traits<char>_> *)pPVar6);
    local_f8 = message_local;
    sStack_f0 = prefix_local._M_len;
    pc._M_str = (char *)prefix_local._M_len;
    pc._M_len = (size_t)message_local;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,pc);
    local_158 = Descriptor::name((Descriptor *)printer_local);
    name_00._M_str = pcVar5;
    name_00._M_len = (size_t)local_158._M_str;
    RubifyConstant_abi_cxx11_(&local_148,(ruby *)local_158._M_len,name_00);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_128,&local_148);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_188,"::");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_b8,(lts_20250127 *)&local_e8,&local_128,(AlphaNum *)local_188,
               (AlphaNum *)pPVar6);
    std::__cxx11::string::~string((string *)&local_148);
    for (local_18c = 0; iVar2 = Descriptor::nested_type_count((Descriptor *)printer_local),
        local_18c < iVar2; local_18c = local_18c + 1) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
      pDVar3 = Descriptor::nested_type((Descriptor *)printer_local,local_18c);
      prefix_00._M_str = (char *)pDVar3;
      prefix_00._M_len = auVar7._8_8_;
      GenerateMessageAssignment(auVar7._0_8_,prefix_00,(Descriptor *)local_28,pPVar6);
    }
    for (local_1a4 = 0; iVar2 = Descriptor::enum_type_count((Descriptor *)printer_local),
        local_1a4 < iVar2; local_1a4 = local_1a4 + 1) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
      pEVar4 = Descriptor::enum_type((Descriptor *)printer_local,local_1a4);
      prefix_01._M_str = (char *)pEVar4;
      prefix_01._M_len = auVar7._8_8_;
      GenerateEnumAssignment(auVar7._0_8_,prefix_01,(EnumDescriptor *)local_28,pPVar6);
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

void GenerateMessageAssignment(absl::string_view prefix,
                               const Descriptor* message,
                               io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the Ruby extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  printer->Print("$prefix$$name$ = ", "prefix", prefix, "name",
                 RubifyConstant(message->name()));
  printer->Print(
      "::Google::Protobuf::DescriptorPool.generated_pool."
      "lookup(\"$full_name$\").msgclass\n",
      "full_name", message->full_name());

  std::string nested_prefix =
      absl::StrCat(prefix, RubifyConstant(message->name()), "::");
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageAssignment(nested_prefix, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumAssignment(nested_prefix, message->enum_type(i), printer);
  }
}